

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

TanhLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_tanh(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x2f8) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x2f8;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.tanh_ = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::TanhLayerParams>(arena);
    (this->layer_).tanh_ = (TanhLayerParams *)LVar2;
  }
  return (TanhLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::TanhLayerParams* NeuralNetworkLayer::_internal_mutable_tanh() {
  if (!_internal_has_tanh()) {
    clear_layer();
    set_has_tanh();
    layer_.tanh_ = CreateMaybeMessage< ::CoreML::Specification::TanhLayerParams >(GetArenaForAllocation());
  }
  return layer_.tanh_;
}